

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall SVGChart::PPlot::CalculateTickInfo(PPlot *this,PRect *inRect,Painter *inPainter)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  float fVar4;
  double dVar5;
  float theDivGuess_1;
  float theTextHeight;
  float theDivGuess;
  int theTextWidth;
  float delta;
  float theYRange;
  float theXRange;
  Painter *inPainter_local;
  PRect *inRect_local;
  PPlot *this_local;
  
  fVar4 = (this->mXAxisSetup).mMax - (this->mXAxisSetup).mMin;
  theTextWidth = (int)((this->mYAxisSetup).mMax - (this->mYAxisSetup).mMin);
  if ((fVar4 <= 0.0) || ((float)theTextWidth < 0.0)) {
    this_local._7_1_ = false;
  }
  else {
    fVar1 = (this->mYAxisSetup).mMax;
    if ((((fVar1 != 0.0) || (NAN(fVar1))) &&
        (dVar5 = std::fabs((double)(ulong)(uint)((float)theTextWidth / (this->mYAxisSetup).mMax)),
        SUB84(dVar5,0) < 0.001)) || (((float)theTextWidth == 0.0 && (!NAN((float)theTextWidth))))) {
      theDivGuess = 0.1;
      fVar1 = (this->mYAxisSetup).mMax;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        dVar5 = std::fabs((double)(ulong)(uint)(this->mYAxisSetup).mMax);
        theDivGuess = SUB84(dVar5,0) * 0.1;
      }
      (this->mYAxisSetup).mMax = theDivGuess + (this->mYAxisSetup).mMax;
      (this->mYAxisSetup).mMin = (this->mYAxisSetup).mMin - theDivGuess;
      theTextWidth = (int)((this->mYAxisSetup).mMax - (this->mYAxisSetup).mMin);
    }
    if (((this->mXAxisSetup).mTickInfo.mAutoTick & 1U) != 0) {
      iVar2 = (*inPainter->_vptr_Painter[8])(inPainter,"12345");
      uVar3 = (*this->mXTickIterator->_vptr_TickIterator[4])
                        ((ulong)(uint)fVar4,(float)inRect->mH,
                         (float)inRect->mW / ((float)iVar2 * 2.0),this->mXTickIterator,
                         &(this->mXAxisSetup).mTickInfo);
      if ((uVar3 & 1) == 0) {
        return false;
      }
    }
    if (((this->mYAxisSetup).mTickInfo.mAutoTick & 1U) != 0) {
      iVar2 = (*inPainter->_vptr_Painter[9])();
      uVar3 = (*this->mYTickIterator->_vptr_TickIterator[4])
                        ((ulong)(uint)theTextWidth,(float)inRect->mW,
                         (float)inRect->mH / ((float)CONCAT44(extraout_var,iVar2) * 3.0),
                         this->mYTickIterator,&(this->mYAxisSetup).mTickInfo);
      if ((uVar3 & 1) == 0) {
        return false;
      }
    }
    iVar2 = (*inPainter->_vptr_Painter[9])();
    SetTickSizes(this,iVar2,&(this->mXAxisSetup).mTickInfo);
    iVar2 = (*inPainter->_vptr_Painter[9])();
    SetTickSizes(this,iVar2,&(this->mYAxisSetup).mTickInfo);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool PPlot::CalculateTickInfo (const PRect &inRect, Painter &inPainter) {
      float theXRange = mXAxisSetup.mMax - mXAxisSetup.mMin;
      float theYRange = mYAxisSetup.mMax - mYAxisSetup.mMin;

      if (theXRange <= 0 || theYRange < 0) {
        return false;
      }

      if ((mYAxisSetup.mMax != 0 && fabs (theYRange / mYAxisSetup.mMax) < kRangeVerySmall) ||
        theYRange == 0) {
        float delta = 0.1f;
        if (mYAxisSetup.mMax != 0) {
            delta *= fabs(mYAxisSetup.mMax);
        }
        
        mYAxisSetup.mMax += delta;
        mYAxisSetup.mMin -= delta;
        theYRange = mYAxisSetup.mMax - mYAxisSetup.mMin;
      }

      if (mXAxisSetup.mTickInfo.mAutoTick) {
        int theTextWidth = inPainter.CalculateTextDrawSize ("12345");
        float theDivGuess = inRect.mW/(kMajorTickXInitialFac*theTextWidth);
        if (!mXTickIterator->InitFromRanges (theXRange, inRect.mH, theDivGuess, mXAxisSetup.mTickInfo)) {
          return false;
        }
      }
      if (mYAxisSetup.mTickInfo.mAutoTick) {
        float theTextHeight = inPainter.GetFontHeight ();
        float theDivGuess = inRect.mH/(kMajorTickYInitialFac*theTextHeight);
        if (!mYTickIterator->InitFromRanges (theYRange, inRect.mW, theDivGuess, mYAxisSetup.mTickInfo)) {
          return false;
        }
      }

      SetTickSizes (inPainter.GetFontHeight (), mXAxisSetup.mTickInfo);
      SetTickSizes (inPainter.GetFontHeight (), mYAxisSetup.mTickInfo);

      return true;
    }